

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

int sx_os_chdir(char *path)

{
  int iVar1;
  
  iVar1 = chdir(path);
  return iVar1;
}

Assistant:

int sx_os_chdir(const char* path)
{
#if SX_PLATFORM_PS4 || SX_PLATFORM_XBOXONE || SX_PLATFORM_WINRT || SX_PLATFORM_ANDROID || SX_PLATFORM_IOS
    sx_unused(path);
    return -1;
#elif SX_PLATFORM_WINDOWS
    return SetCurrentDirectoryA(path);
#else
    return chdir(path);
#endif    // SX_COMPILER_
}